

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

int __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::copy
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *src_00;
  Hdr *hdr;
  int iVar1;
  
  if (dst != (EVP_PKEY_CTX *)this) {
    src_00 = *(EVP_PKEY_CTX **)(dst + 0x10);
    if (src_00 == (EVP_PKEY_CTX *)0x0) {
      setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::Construct>(this,0);
      return 0;
    }
    hdr = *(Hdr **)(dst + 8);
    if ((hdr == (Hdr *)0x0) || ((hdr->m_flags & 4) != 0)) {
      iVar1 = copy(this,*(EVP_PKEY_CTX **)dst,src_00);
      return iVar1;
    }
    ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::attach
              (&this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>,hdr,
               *(unsigned_long **)dst,(size_t)src_00);
  }
  return (int)(this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count;
}

Assistant:

size_t
	copy(const ArrayRef& src) {
		if (&src == this)
			return this->m_count;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		Hdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive))
			return copy(src, src.getCount());

		this->attach(src);
		return this->m_count;
	}